

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::DirectoryContentsTask::inputsAvailable
          (DirectoryContentsTask *this,TaskInterface ti)

{
  Kind KVar1;
  pointer pbVar2;
  FileInfo *pFVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  long lVar4;
  uint64_t *puVar5;
  long lVar6;
  byte bVar7;
  StringRef path;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  FileInfo in_stack_fffffffffffffee8;
  TaskInterface ti_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  BuildValue local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  bVar7 = 0;
  KVar1 = (this->directoryValue).kind;
  if (KVar1 == SkippedCommand) {
    local_a0.kind = SkippedCommand;
  }
  else {
    if (KVar1 != MissingOutput) {
      if (KVar1 == FailedInput) {
        local_a0.kind = FailedInput;
        goto LAB_0013e484;
      }
      if (KVar1 != MissingInput) {
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        path.Length = (size_t)&filenames;
        path.Data = (char *)(this->path)._M_string_length;
        getContents((DirectoryContentsTask *)(this->path)._M_dataplus._M_p,path,in_RCX);
        pFVar3 = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
        pbVar2 = filenames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)filenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)filenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = (uint64_t *)&stack0xfffffffffffffee8;
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar5 = pFVar3->device;
          pFVar3 = (FileInfo *)((long)pFVar3 + (ulong)bVar7 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        }
        values.Length = lVar6 >> 5;
        values.Data = pbVar2;
        llbuild::buildsystem::BuildValue::BuildValue
                  (&local_a0,DirectoryContents,in_stack_fffffffffffffee8,values);
        llbuild::buildsystem::BuildValue::toData((ValueType *)&local_30,&local_a0);
        llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&local_30,false);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
        llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&filenames);
        return;
      }
    }
    local_a0.kind = MissingInput;
  }
LAB_0013e484:
  local_a0._4_8_ = 0;
  local_a0._12_8_ = 0;
  local_a0.valueData._4_8_ = 0;
  local_a0.valueData._12_8_ = 0;
  local_a0.valueData._20_8_ = 0;
  local_a0.valueData._28_8_ = 0;
  local_a0.valueData._36_8_ = 0;
  local_a0.valueData._44_8_ = 0;
  local_a0.valueData._52_8_ = 0;
  local_a0.valueData._60_8_ = 0;
  local_a0.valueData._68_8_ = 0;
  local_a0.valueData._76_4_ = 0;
  local_a0.stringValues.contents._0_4_ = 0;
  local_a0.stringValues.contents._4_4_ = 0;
  local_a0.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&filenames,&local_a0);
  llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&filenames,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filenames);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.
    
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (directoryValue.isMissingOutput()) {
      // Rewrite a missing output as a missing input build value for this node, both conceptually and as a hedge against violating the downstream expectations of other rules.
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (directoryValue.isFailedInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    // The input directory may be a 'mkdir' command, which can be cancelled or
    // skipped by the engine or the delegate. rdar://problem/50380532
    if (directoryValue.isSkippedCommand()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    std::vector<std::string> filenames;
    std::error_code ec = getContents(path, filenames);

    // Currently, tests and presumably clients expect that errors are silently
    // ignored when reading directory contents listings.
    (void)ec;

    // Create the result.
    ti.complete(BuildValue::makeDirectoryContents(directoryValue.getOutputInfo(),
                                                  filenames).toData());
  }